

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::LoadConstantNDLayerParams::Clear(LoadConstantNDLayerParams *this)

{
  (this->shape_).current_size_ = 0;
  if (this->data_ != (WeightParams *)0x0) {
    (*(this->data_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->data_ = (WeightParams *)0x0;
  return;
}

Assistant:

void LoadConstantNDLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.LoadConstantNDLayerParams)
  shape_.Clear();
  if (GetArenaNoVirtual() == NULL && data_ != NULL) {
    delete data_;
  }
  data_ = NULL;
}